

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O1

_Bool spell_cast(wchar_t spell_index,wchar_t dir,command *cmd)

{
  uint32_t *puVar1;
  byte bVar2;
  short sVar3;
  effect *effect;
  player *ppVar4;
  wchar_t *pwVar5;
  _Bool _Var6;
  int16_t iVar7;
  wchar_t wVar8;
  uint32_t uVar9;
  wchar_t *pwVar10;
  char *dice_string;
  int iVar11;
  undefined4 in_register_00000034;
  int iVar12;
  wchar_t wVar13;
  class_spell *pcVar14;
  source sVar15;
  source origin;
  source origin_00;
  _Bool ident;
  int local_44;
  command *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,dir);
  ident = false;
  wVar13 = (wchar_t)player->lev;
  local_40 = cmd;
  _Var6 = flag_has_dbg((player->state).pflags,10,0x44,"player->state.pflags","(PF_HEIGHTEN_MAGIC)");
  if (_Var6) {
    wVar13 = wVar13 + (player->heighten_power + 5) / 10 + L'\x01';
  }
  _Var6 = flag_has_dbg((player->state).pflags,10,0x47,"player->state.pflags","(PF_CHANNELING)");
  if (_Var6) {
    wVar8 = player_get_channeling_boost(player);
    wVar13 = wVar8 + wVar13;
  }
  _Var6 = flag_has_dbg((player->state).pflags,10,0x1b,"player->state.pflags","(PF_BEAM)");
  wVar8 = wVar13 / 2;
  if (_Var6) {
    wVar8 = wVar13;
  }
  if (spell_index < L'\0') {
    pcVar14 = (class_spell *)0x0;
  }
  else {
    pcVar14 = (class_spell *)0x0;
    if (spell_index < (player->class->magic).total_spells) {
      pwVar5 = &((player->class->magic).books)->num_spells;
      do {
        pwVar10 = pwVar5;
        iVar12 = (int)pcVar14;
        wVar13 = *pwVar10 + iVar12;
        pcVar14 = (class_spell *)(ulong)(uint)wVar13;
        pwVar5 = pwVar10 + 8;
      } while (wVar13 <= spell_index);
      pcVar14 = *(class_spell **)(pwVar10 + 3) + (spell_index - iVar12);
    }
  }
  iVar7 = spell_chance(spell_index);
  iVar12 = (int)iVar7;
  uVar9 = Rand_div(100);
  if ((int)uVar9 < iVar12) {
    event_signal(EVENT_INPUT_FLUSH);
    msg("You failed to concentrate hard enough!");
  }
  else {
    effect = pcVar14->effect;
    local_44 = iVar12;
    sVar15 = source_player();
    origin.which = sVar15.which;
    origin._4_4_ = 0;
    origin.what = sVar15.what;
    _Var6 = effect_do(effect,origin,(object *)0x0,&ident,true,(wchar_t)local_38,wVar8,L'\0',local_40
                     );
    if (!_Var6) {
      return false;
    }
    _Var6 = flag_has_dbg((player->state).pflags,10,0x23,"player->state.pflags","(PF_COMBAT_REGEN)");
    if (_Var6) {
      convert_mana_to_hp(player,pcVar14->smana << 0x10);
    }
    sound(0x95);
    iVar12 = local_44;
    bVar2 = player->spell_flags[spell_index];
    if ((bVar2 & 2) == 0) {
      wVar13 = pcVar14->sexp;
      player->spell_flags[spell_index] = bVar2 | 2;
      player_exp_gain(player,wVar13 * pcVar14->slevel);
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x200000;
    }
  }
  ppVar4 = player;
  wVar13 = pcVar14->smana;
  sVar3 = player->csp;
  iVar11 = wVar13 - sVar3;
  if (iVar11 == 0 || wVar13 < sVar3) {
    player->csp = sVar3 - (short)wVar13;
    if ((iVar12 <= (int)uVar9) &&
       (_Var6 = flag_has_dbg((ppVar4->state).pflags,10,0x46,"player->state.pflags","(PF_HARMONY)"),
       _Var6)) {
      iVar12 = 10;
      if (pcVar14->smana < L'\x15') {
        iVar12 = pcVar14->smana / 3 + 3;
      }
      sVar3 = player->mhp;
      sVar15 = source_player();
      origin_00.which = sVar15.which;
      dice_string = format("%d",(ulong)(uint)((sVar3 * iVar12) / 100));
      origin_00._4_4_ = 0;
      origin_00.what = sVar15.what;
      effect_simple(L'\x03',origin_00,dice_string,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    }
  }
  else {
    ppVar4->csp = 0;
    ppVar4->csp_frac = 0;
    player_over_exert(ppVar4,L'\x02',L'd',iVar11 * 5 + L'\x01');
    player_over_exert(player,L'\x01',L'2',L'\0');
  }
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x80;
  return true;
}

Assistant:

bool spell_cast(int spell_index, int dir, struct command *cmd)
{
	int chance;
	bool ident = false;
	int beam  = beam_chance();
	bool failed = false;

	/* Get the spell */
	const struct class_spell *spell = spell_by_index(player, spell_index);

	/* Spell failure chance */
	chance = spell_chance(spell_index);

	/* Fail or succeed */
	if (randint0(100) < chance) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to concentrate hard enough!");
		failed = true;
	} else {
		/* Cast the spell */
		if (!effect_do(spell->effect, source_player(), NULL, &ident, true, dir,
					   beam, 0, cmd)) {
			return false;
		}

		/* Reward COMBAT_REGEN with small HP recovery */
		if (player_has(player, PF_COMBAT_REGEN)) {
			convert_mana_to_hp(player, spell->smana << 16);
		}

		/* A spell was cast */
		sound(MSG_SPELL);

		if (!(player->spell_flags[spell_index] & PY_SPELL_WORKED)) {
			int e = spell->sexp;

			/* The spell worked */
			player->spell_flags[spell_index] |= PY_SPELL_WORKED;

			/* Gain experience */
			player_exp_gain(player, e * spell->slevel);

			/* Redraw object recall */
			player->upkeep->redraw |= (PR_OBJECT);
		}
	}

	/* Sufficient mana? */
	if (spell->smana <= player->csp) {
		/* Use some mana */
		player->csp -= spell->smana;

		/* Specialty ability Harmony */
		if (!failed && player_has(player, PF_HARMONY)) {
			/* Percentage of max hp to be regained, capped at 10% */
			int frac = MIN(10, 3 + (spell->smana / 3));

			/* Calculate fractional bonus */
			int boost = (frac * player->mhp) / 100;

			/* Apply bonus */
			effect_simple(EF_HEAL_HP, source_player(), format("%d", boost), 0,
						  0, 0, 0, 0, NULL);
		}
	} else {
		int oops = spell->smana - player->csp;

		/* No mana left */
		player->csp = 0;
		player->csp_frac = 0;

		/* Over-exert the player */
		player_over_exert(player, PY_EXERT_FAINT, 100, 5 * oops + 1);
		player_over_exert(player, PY_EXERT_CON, 50, 0);
	}

	/* Redraw mana */
	player->upkeep->redraw |= (PR_MANA);

	return true;
}